

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

int16_t float32_to_q16(float32 a,float_status *status)

{
  byte bVar1;
  uint8_t flags;
  float32 a_00;
  int32_t iVar2;
  
  if ((a & 0x7fffffff) < 0x7f800001) {
    a_00 = float32_scalbn_mips64el(a,0xf,status);
    bVar1 = status->float_exception_flags;
    status->float_exception_flags = bVar1 & 0xef;
    if ((bVar1 & 8) == 0) {
      iVar2 = float32_to_int32_mips64el(a_00,status);
      bVar1 = status->float_exception_flags;
      status->float_exception_flags = bVar1 & 0xef;
      if ((bVar1 & 1) == 0) {
        if (iVar2 < -0x8000) {
          float_raise_mips64el('(',status);
          iVar2 = 0x8000;
        }
        else if (0x7fff < iVar2) {
          float_raise_mips64el('(',status);
          iVar2 = 0x7fff;
        }
        goto LAB_00862099;
      }
      status->float_exception_flags = bVar1 & 0xfe;
      flags = '(';
    }
    else {
      flags = ' ';
    }
    float_raise_mips64el(flags,status);
    iVar2 = 0x7fff - ((int)a_00 >> 0x1f);
  }
  else {
    float_raise_mips64el('\x01',status);
    iVar2 = 0;
  }
LAB_00862099:
  return (int16_t)iVar2;
}

Assistant:

static inline int16_t float32_to_q16(float32 a, float_status *status)
{
    int32_t q_val;
    int32_t q_min = 0xffff8000;
    int32_t q_max = 0x00007fff;

    int ieee_ex;

    if (float32_is_any_nan(a)) {
        float_raise(float_flag_invalid, status);
        return 0;
    }

    /* scaling */
    a = float32_scalbn(a, 15, status);

    ieee_ex = get_float_exception_flags(status);
    set_float_exception_flags(ieee_ex & (~float_flag_underflow)
                             , status);

    if (ieee_ex & float_flag_overflow) {
        float_raise(float_flag_inexact, status);
        return (int32_t)a < 0 ? q_min : q_max;
    }

    /* conversion to int */
    q_val = float32_to_int32(a, status);

    ieee_ex = get_float_exception_flags(status);
    set_float_exception_flags(ieee_ex & (~float_flag_underflow)
                             , status);

    if (ieee_ex & float_flag_invalid) {
        set_float_exception_flags(ieee_ex & (~float_flag_invalid)
                               , status);
        float_raise(float_flag_overflow | float_flag_inexact, status);
        return (int32_t)a < 0 ? q_min : q_max;
    }

    if (q_val < q_min) {
        float_raise(float_flag_overflow | float_flag_inexact, status);
        return (int16_t)q_min;
    }

    if (q_max < q_val) {
        float_raise(float_flag_overflow | float_flag_inexact, status);
        return (int16_t)q_max;
    }

    return (int16_t)q_val;
}